

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

sample_type __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy>::
encode_run_interruption_pixel
          (jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy> *this,
          int32_t x,int32_t ra,int32_t rb)

{
  char cVar1;
  sample_type sVar2;
  char cVar3;
  
  sVar2 = (sample_type)x;
  if (ra == rb) {
    encode_run_interruption_error
              (this,(this->context_run_mode_)._M_elems + 1,(int)(char)(sVar2 - (char)ra));
  }
  else {
    cVar3 = (ra <= rb) * '\x02' + -1;
    cVar1 = (sVar2 - (char)rb) * cVar3;
    encode_run_interruption_error(this,(this->context_run_mode_)._M_elems,(int)cVar1);
    sVar2 = cVar1 * cVar3 + (char)rb;
  }
  return sVar2;
}

Assistant:

sample_type encode_run_interruption_pixel(const int32_t x, const int32_t ra, const int32_t rb)
    {
        if (std::abs(ra - rb) <= traits_.near_lossless)
        {
            const int32_t error_value{traits_.compute_error_value(x - ra)};
            encode_run_interruption_error(context_run_mode_[1], error_value);
            return static_cast<sample_type>(traits_.compute_reconstructed_sample(ra, error_value));
        }

        const int32_t error_value{traits_.compute_error_value((x - rb) * sign(rb - ra))};
        encode_run_interruption_error(context_run_mode_[0], error_value);
        return static_cast<sample_type>(traits_.compute_reconstructed_sample(rb, error_value * sign(rb - ra)));
    }